

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O3

int file_open_read(file_t *file,char *filename)

{
  int iVar1;
  stat sb;
  stat sStack_a8;
  
  if (file == (file_t *)0x0) {
    __assert_fail("file != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/file.c",0x36,
                  "int file_open_read(file_t *, char *)");
  }
  if (filename == (char *)0x0) {
    __assert_fail("filename != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/file.c",0x37,
                  "int file_open_read(file_t *, char *)");
  }
  if ((*filename == '-') && (filename[1] == '\0')) {
    file->fd = 0;
    file->size = 0;
  }
  else {
    iVar1 = open(filename,0);
    file->fd = iVar1;
    if (iVar1 < 0) {
      perror("open");
      return 0;
    }
    iVar1 = stat(filename,&sStack_a8);
    if (iVar1 < 0) {
      perror("stat");
      return 0;
    }
    file->size = sStack_a8.st_size;
  }
  file->offset = 0;
  return 1;
}

Assistant:

int file_open_read(file_t *file, char *filename) {
  assert(file != NULL);
  assert(filename != NULL);

  if (strcmp(filename, "-") == 0) {
    /* read from stdin */
    file->fd   = STDIN_FILENO;
    file->size = 0;
  } else {
    file->fd = open(filename, O_RDONLY);

    if (file->fd < 0) {
      perror("open");
      return 0;
    }

    struct stat sb;
    if (stat(filename, &sb) < 0) {
      perror("stat");
      return 0;
    }
    file->size = (unsigned long)sb.st_size;
  }

  file->offset = 0;

  return 1;
}